

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_dropout(NetOptimize *this)

{
  int iVar1;
  Layer *pLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  int *piVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  uVar7 = (ulong)((long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_Net).layers.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar8 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar8 = 0;
  }
  lVar9 = -1;
  uVar7 = 0;
  do {
    if (uVar7 == uVar8) {
      return 0;
    }
    bVar6 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7]->type,"Dropout");
    if ((!bVar6) &&
       (pLVar2 = (this->super_Net).layers.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7], *(float *)&pLVar2[1]._vptr_Layer == 1.0))
    {
      iVar1 = *(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = lVar9; lVar10 != -1 && -1 < lVar10 + 1; lVar10 = lVar10 + -1) {
        bVar6 = std::operator==(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar10]->type,"ncnnfused")
        ;
        if (!bVar6) {
          ppLVar3 = (this->super_Net).layers.
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar4 = ppLVar3[lVar10];
          piVar5 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (((long)*(pointer *)
                      ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                      8) - (long)piVar5 == 4) && (*piVar5 == iVar1)) {
            pLVar4 = ppLVar3[lVar10];
            fprintf(_stderr,"eliminate_dropout %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                    (pLVar2->name)._M_dataplus._M_p);
            iVar1 = *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
            (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar1].producer = (int)lVar10;
            std::__cxx11::string::assign((char *)&pLVar2->type);
            break;
          }
        }
      }
    }
    uVar7 = uVar7 + 1;
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_dropout()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Dropout")
            continue;

        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[i];
        if (dropout->scale != 1.f)
            continue;

        // Any - Dropout
        int bottom_blob_index = layers[i]->bottoms[0];

        int j = i - 1;
        for (; j>=0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            if (layers[j]->tops.size() != 1)
                continue;

            if (layers[j]->tops[0] == bottom_blob_index)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_dropout %s %s\n", any->name.c_str(), dropout->name.c_str());

        int top_blob_index_final = dropout->tops[0];
        any->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        dropout->type = "ncnnfused";
    }

    return 0;
}